

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx512::LineSegmentsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 auVar1 [16];
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar19 [64];
  undefined1 auVar21 [64];
  
  aVar18.m128[2] = INFINITY;
  aVar18._0_8_ = 0x7f8000007f800000;
  aVar18.m128[3] = INFINITY;
  auVar19 = ZEXT1664((undefined1  [16])aVar18);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar18;
  aVar20.m128[2] = -INFINITY;
  aVar20._0_8_ = 0xff800000ff800000;
  aVar20.m128[3] = -INFINITY;
  auVar21 = ZEXT1664((undefined1  [16])aVar20);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar20;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar14 = r->_begin;
  sVar12 = __return_storage_ptr__->end;
  aVar24 = aVar18;
  aVar22 = aVar20;
  if (uVar14 < r->_end) {
    auVar26._8_4_ = 0xddccb9a2;
    auVar26._0_8_ = 0xddccb9a2ddccb9a2;
    auVar26._12_4_ = 0xddccb9a2;
    auVar27._8_4_ = 0x5dccb9a2;
    auVar27._0_8_ = 0x5dccb9a25dccb9a2;
    auVar27._12_4_ = 0x5dccb9a2;
    auVar25 = ZEXT1664((undefined1  [16])aVar18);
    auVar23 = ZEXT1664((undefined1  [16])aVar20);
    do {
      pBVar3 = (this->super_LineSegments).vertices.items;
      uVar2 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                       *(long *)&(this->super_LineSegments).field_0x68 * uVar14);
      uVar15 = (ulong)(uVar2 + 1);
      if (uVar15 < (pBVar3->super_RawBufferView).num) {
        lVar17 = 0;
        bVar11 = false;
        do {
          bVar10 = bVar11;
          if (bVar10) break;
          pcVar4 = pBVar3[lVar17].super_RawBufferView.ptr_ofs;
          sVar13 = pBVar3[lVar17].super_RawBufferView.stride;
          auVar1 = *(undefined1 (*) [16])(pcVar4 + sVar13 * uVar2);
          uVar8 = vcmpps_avx512vl(auVar1,auVar26,6);
          uVar9 = vcmpps_avx512vl(auVar1,auVar27,1);
          if ((byte)((byte)uVar8 & (byte)uVar9) != 0xf) break;
          auVar29 = *(undefined1 (*) [16])(pcVar4 + sVar13 * uVar15);
          uVar8 = vcmpps_avx512vl(auVar29,auVar26,6);
          uVar9 = vcmpps_avx512vl(auVar29,auVar27,1);
          if ((byte)((byte)uVar8 & (byte)uVar9) != 0xf) break;
          auVar1 = vshufps_avx(auVar1,auVar1,0xff);
          auVar29 = vshufps_avx(auVar29,auVar29,0xff);
          auVar1 = vminss_avx(auVar1,auVar29);
          lVar17 = 1;
          bVar11 = true;
        } while (0.0 <= auVar1._0_4_);
      }
      else {
        bVar10 = false;
      }
      sVar13 = k;
      if (bVar10) {
        pcVar4 = (this->super_LineSegments).vertices0.super_RawBufferView.ptr_ofs;
        sVar13 = (this->super_LineSegments).vertices0.super_RawBufferView.stride;
        lVar17 = uVar2 * sVar13;
        lVar16 = uVar15 * sVar13;
        auVar28 = vminps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),
                             *(undefined1 (*) [16])(pcVar4 + lVar16));
        auVar29 = vmaxss_avx(ZEXT416(*(uint *)(pcVar4 + lVar16 + 0xc)),
                             ZEXT416(*(uint *)(pcVar4 + lVar17 + 0xc)));
        auVar1 = vmaxps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),
                            *(undefined1 (*) [16])(pcVar4 + lVar16));
        fVar7 = auVar29._0_4_ * (this->super_LineSegments).maxRadiusScale;
        auVar30._4_4_ = fVar7;
        auVar30._0_4_ = fVar7;
        auVar30._8_4_ = fVar7;
        auVar30._12_4_ = fVar7;
        auVar29 = vsubps_avx(auVar28,auVar30);
        auVar28._0_4_ = auVar1._0_4_ + fVar7;
        auVar28._4_4_ = auVar1._4_4_ + fVar7;
        auVar28._8_4_ = auVar1._8_4_ + fVar7;
        auVar28._12_4_ = auVar1._12_4_ + fVar7;
        aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar29,ZEXT416(geomID),0x30);
        aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar28,ZEXT416((uint)uVar14),0x30);
        auVar1 = vminps_avx(auVar19._0_16_,(undefined1  [16])aVar5);
        auVar19 = ZEXT1664(auVar1);
        auVar1 = vmaxps_avx(auVar21._0_16_,(undefined1  [16])aVar6);
        auVar21 = ZEXT1664(auVar1);
        auVar29._0_4_ = aVar6.x + aVar5.x;
        auVar29._4_4_ = aVar6.y + aVar5.y;
        auVar29._8_4_ = aVar6.z + aVar5.z;
        auVar29._12_4_ = aVar6.field_3.w + aVar5.field_3.w;
        auVar1 = vminps_avx(auVar25._0_16_,auVar29);
        auVar25 = ZEXT1664(auVar1);
        auVar1 = vmaxps_avx(auVar23._0_16_,auVar29);
        auVar23 = ZEXT1664(auVar1);
        sVar12 = sVar12 + 1;
        sVar13 = k + 1;
        prims[k].lower.field_0.field_1 = aVar5;
        prims[k].upper.field_0.field_1 = aVar6;
      }
      aVar22 = auVar23._0_16_;
      aVar24 = auVar25._0_16_;
      aVar20 = auVar21._0_16_;
      aVar18 = auVar19._0_16_;
      uVar14 = uVar14 + 1;
      k = sVar13;
    } while (uVar14 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar24;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar22;
  __return_storage_ptr__->end = sVar12;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,&bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }